

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_editor.c
# Opt level: O1

int binbuf_getpos(_binbuf *b,int *x0,int *y0,t_symbol **type)

{
  bool bVar1;
  uint uVar2;
  uint uVar3;
  t_atom *a;
  t_symbol *ptVar4;
  t_symbol *ptVar5;
  t_atom *ptVar6;
  uint uVar7;
  uint uVar8;
  int iVar9;
  uint uVar10;
  t_atom *a_00;
  int iVar11;
  int iVar12;
  t_float tVar13;
  int local_50;
  
  a = binbuf_getvec(b);
  uVar2 = binbuf_getnatom(b);
  uVar7 = uVar2;
  if ((2 < (int)uVar2) && (ptVar4 = atom_getsymbol(a), ptVar4 == &s__N)) {
    ptVar4 = atom_getsymbol(a + 1);
    ptVar5 = gensym("canvas");
    if (ptVar4 == ptVar5) {
      iVar11 = 0;
      local_50 = 0;
      a_00 = a;
      uVar3 = uVar2;
      do {
        iVar9 = -1;
        ptVar6 = a_00;
        do {
          ptVar6 = ptVar6 + 1;
          uVar10 = uVar3;
          if (uVar3 + iVar9 == -1) goto LAB_00146296;
          iVar9 = iVar9 + -1;
        } while (ptVar6->a_type != A_SEMI);
        uVar10 = -iVar9;
LAB_00146296:
        if (uVar10 == 0) {
          uVar8 = 2;
        }
        else {
          if (1 < (int)uVar10) {
            ptVar4 = atom_getsymbol(a_00 + 1);
            ptVar5 = gensym("restore");
            if (ptVar4 == ptVar5) {
              ptVar4 = atom_getsymbol(a_00);
              local_50 = local_50 - (uint)(ptVar4 == &s__X);
            }
            ptVar4 = atom_getsymbol(a_00 + 1);
            ptVar5 = gensym("canvas");
            if (ptVar4 == ptVar5) {
              ptVar4 = atom_getsymbol(a_00);
              local_50 = local_50 + (uint)(ptVar4 == &s__N);
            }
          }
          iVar11 = iVar11 + uVar10;
          uVar8 = uVar3 - uVar10 >> 0x1f;
          a = a_00;
          a_00 = a_00 + (int)uVar10;
          uVar7 = uVar3;
          uVar3 = uVar3 - uVar10;
        }
        bVar1 = true;
        if (uVar8 != 0) {
          if (uVar8 != 2) {
            bVar1 = false;
            a = a_00;
            uVar7 = uVar3;
          }
          break;
        }
      } while (0 < local_50);
      if (!bVar1) {
        return 0;
      }
      goto LAB_0014612c;
    }
  }
  iVar11 = 0;
LAB_0014612c:
  if (((int)uVar7 < 4) || (ptVar4 = atom_getsymbol(a), ptVar4 != &s__X)) {
    iVar11 = 0;
  }
  else {
    ptVar4 = atom_getsymbol(a + 1);
    ptVar5 = gensym("restore");
    if ((((ptVar5 != ptVar4) && (ptVar5 = gensym("obj"), ptVar5 != ptVar4)) &&
        (ptVar5 = gensym("msg"), ptVar5 != ptVar4)) &&
       (((ptVar5 = gensym("text"), ptVar5 != ptVar4 &&
         (ptVar5 = gensym("floatatom"), ptVar5 != ptVar4)) &&
        ((ptVar5 = gensym("listbox"), ptVar5 != ptVar4 &&
         (ptVar5 = gensym("symbolatom"), ptVar5 != ptVar4)))))) {
      return 0;
    }
    if (x0 != (int *)0x0) {
      tVar13 = atom_getfloat(a + 2);
      *x0 = (int)tVar13;
    }
    if (y0 != (int *)0x0) {
      tVar13 = atom_getfloat(a + 3);
      *y0 = (int)tVar13;
    }
    if (type != (t_symbol **)0x0) {
      *type = ptVar4;
    }
    iVar9 = uVar7 + iVar11;
    do {
      iVar11 = iVar11 + 1;
      iVar12 = iVar11;
      if (a->a_type == A_SEMI) break;
      a = a + 1;
      uVar7 = uVar7 - 1;
      iVar12 = iVar9;
    } while (uVar7 != 0);
    iVar11 = (iVar12 < (int)uVar2) + 1;
  }
  return iVar11;
}

Assistant:

static int binbuf_getpos(t_binbuf*b, int *x0, int *y0, t_symbol**type)
{
        /*
         * checks how many objects the binbuf contains and where they are located
         * for simplicity, we stop after the first object...
         * "objects" are any patchable things
         * returns: 0: no objects/...
         *          1: single object in binbuf
         *          2: more than one object in binbuf
         * (x0,y0) are the coordinates of the first object
         * (type) is the type of the first object ("obj", "msg",...)
         */
    t_atom*argv = binbuf_getvec(b);
    int argc = binbuf_getnatom(b);
    const int argc0 = argc;
    int count = 0;
    t_symbol*s;
        /* get the position of the first object in the argv binbuf */
    if(argc > 2
       && atom_getsymbol(argv+0) == &s__N
       && atom_getsymbol(argv+1) == gensym("canvas"))
    {
        int ac = argc;
        t_atom*ap = argv;
        int stack = 0;
        do {
            int off = binbuf_nextmess(argc, argv);
            if(!off)
                break;
            ac = argc;
            ap = argv;
            argc-=off;
            argv+=off;
            count+=off;
            if(off >= 2)
            {
                if (atom_getsymbol(ap+1) == gensym("restore")
                    && atom_getsymbol(ap) == &s__X)
                    {
                        stack--;
                    }
                if (atom_getsymbol(ap+1) == gensym("canvas")
                    && atom_getsymbol(ap) == &s__N)
                    {
                        stack++;
                    }
            }
            if(argc<0)
                return 0;
        } while (stack>0);
        argc = ac;
        argv = ap;
    }
    if(argc < 4 || atom_getsymbol(argv) != &s__X)
        return 0;
        /* #X obj|msg|text|floatatom|symbolatom <x> <y> ...
         * TODO: subpatches #N canvas + #X restore <x> <y>
         */
    s = atom_getsymbol(argv+1);
    if(gensym("restore") == s
       || gensym("obj") == s
       || gensym("msg") == s
       || gensym("text") == s
       || gensym("floatatom") == s
       || gensym("listbox") == s
       || gensym("symbolatom") == s)
    {
        if(x0)*x0=atom_getfloat(argv+2);
        if(y0)*y0=atom_getfloat(argv+3);
        if(type)*type=s;
    } else
        return 0;

        /* no wind the binbuf to the next message */
    while(argc--)
    {
        count++;
        if (A_SEMI == argv->a_type)
            break;
        argv++;
    }
    return 1+(argc0 > count);
}